

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_tooltip(nk_context *ctx,char *text)

{
  undefined8 uVar1;
  int iVar2;
  nk_bool nVar3;
  long *plVar4;
  char *in_RSI;
  long in_RDI;
  float fVar5;
  float unaff_retaddr;
  nk_context *in_stack_00000008;
  float text_height;
  float text_width;
  int text_len;
  nk_vec2 padding;
  nk_style *style;
  int in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  float fStack_1c;
  
  if ((((in_RDI != 0) && (*(long *)(in_RDI + 0x40d8) != 0)) &&
      (*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) != 0)) && (in_RSI != (char *)0x0)) {
    plVar4 = (long *)(in_RDI + 0x168);
    uVar1 = *(undefined8 *)(in_RDI + 0x1ea4);
    iVar2 = nk_strlen(in_RSI);
    (**(code **)(*plVar4 + 0x10))(*(undefined4 *)(*plVar4 + 8),*(undefined8 *)*plVar4,in_RSI,iVar2);
    fStack_1c = (float)((ulong)uVar1 >> 0x20);
    fVar5 = fStack_1c + fStack_1c + *(float *)(*plVar4 + 8);
    nVar3 = nk_tooltip_begin(in_stack_00000008,unaff_retaddr);
    if (nVar3 != 0) {
      nk_layout_row_dynamic
                ((nk_context *)CONCAT44(fVar5,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
                 in_stack_ffffffffffffffc8);
      nk_text((nk_context *)CONCAT44(fVar5,in_stack_ffffffffffffffd0),
              (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0,0x1457c1);
      nk_tooltip_end((nk_context *)0x1457cb);
    }
  }
  return;
}

Assistant:

NK_API void
nk_tooltip(struct nk_context *ctx, const char *text)
{
const struct nk_style *style;
struct nk_vec2 padding;

int text_len;
float text_width;
float text_height;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
NK_ASSERT(text);
if (!ctx || !ctx->current || !ctx->current->layout || !text)
return;

/* fetch configuration data */
style = &ctx->style;
padding = style->window.padding;

/* calculate size of the text and tooltip */
text_len = nk_strlen(text);
text_width = style->font->width(style->font->userdata,
style->font->height, text, text_len);
text_width += (4 * padding.x);
text_height = (style->font->height + 2 * padding.y);

/* execute tooltip and fill with text */
if (nk_tooltip_begin(ctx, (float)text_width)) {
nk_layout_row_dynamic(ctx, (float)text_height, 1);
nk_text(ctx, text, text_len, NK_TEXT_LEFT);
nk_tooltip_end(ctx);
}
}